

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool clip_image_load_from_bytes(uchar *bytes,size_t bytes_length,clip_image_u8 *img)

{
  stbi_uc *psVar1;
  uchar *in_RDX;
  stbi_uc *data;
  int nc;
  int ny;
  int nx;
  int in_stack_000000ac;
  int *in_stack_000000b0;
  int *in_stack_000000b8;
  int *in_stack_000000c0;
  int in_stack_000000cc;
  stbi_uc *in_stack_000000d0;
  clip_image_u8 *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  bool local_1;
  
  psVar1 = stbi_load_from_memory
                     (in_stack_000000d0,in_stack_000000cc,in_stack_000000c0,in_stack_000000b8,
                      in_stack_000000b0,in_stack_000000ac);
  if (psVar1 == (stbi_uc *)0x0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to decode image bytes\n",
                        "clip_image_load_from_bytes");
    }
    local_1 = false;
  }
  else {
    clip_build_img_from_pixels
              (in_RDX,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
    ;
    stbi_image_free((void *)0x1a3178);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool clip_image_load_from_bytes(const unsigned char * bytes, size_t bytes_length, struct clip_image_u8 * img) {
    int nx, ny, nc;
    auto * data = stbi_load_from_memory(bytes, bytes_length, &nx, &ny, &nc, 3);
    if (!data) {
        LOG_ERR("%s: failed to decode image bytes\n", __func__);
        return false;
    }
    clip_build_img_from_pixels(data, nx, ny, img);
    stbi_image_free(data);
    return true;
}